

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int CollectionCacheInstallRecord(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  uint uVar1;
  jx9_vm *pjVar2;
  unqlite_col *puVar3;
  unqlite_col *puVar4;
  sxu32 sVar5;
  sxi32 sVar6;
  unqlite_col_record *puVar7;
  ulong uVar8;
  unqlite_col_record *puVar9;
  unqlite_col_record *puVar10;
  unqlite_col_record *puVar11;
  unqlite_col_record **ppuVar12;
  uint uVar13;
  bool bVar14;
  
  if (pCol->nRec != 0) {
    for (puVar7 = pCol->apRecord[(uint)nId & pCol->nRecSize - 1];
        puVar7 != (unqlite_col_record *)0x0; puVar7 = puVar7->pNextCol) {
      if (puVar7->nId == nId) {
        sVar6 = jx9MemObjStore(pValue,&puVar7->sValue);
        return sVar6;
      }
    }
  }
  puVar7 = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,0x70);
  if (puVar7 != (unqlite_col_record *)0x0) {
    uVar8 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&puVar7->pCol + uVar8 + 4) = 0;
      uVar8 = uVar8 + 4;
    } while (uVar8 < 0x6c);
    pjVar2 = pCol->pVm->pJx9Vm;
    (puVar7->sValue).pVm = (jx9_vm *)0x0;
    (puVar7->sValue).sBlob.pAllocator = (SyMemBackend *)0x0;
    (puVar7->sValue).x.rVal = 0.0;
    *(undefined8 *)&(puVar7->sValue).iFlags = 0;
    *(undefined8 *)&(puVar7->sValue).sBlob.nFlags = 0;
    *(undefined8 *)&(puVar7->sValue).nIdx = 0;
    (puVar7->sValue).pVm = pjVar2;
    (puVar7->sValue).sBlob.pBlob = (void *)0x0;
    (puVar7->sValue).sBlob.nByte = 0;
    (puVar7->sValue).sBlob.mByte = 0;
    (puVar7->sValue).sBlob.pAllocator = &pjVar2->sAllocator;
    (puVar7->sValue).iFlags = 0x20;
    jx9MemObjStore(pValue,&puVar7->sValue);
    puVar7->nId = nId;
    puVar7->pCol = pCol;
    uVar1 = pCol->nRecSize;
    uVar13 = (uint)nId & uVar1 - 1;
    ppuVar12 = pCol->apRecord;
    puVar9 = ppuVar12[uVar13];
    puVar7->pNextCol = puVar9;
    if (puVar9 != (unqlite_col_record *)0x0) {
      puVar9->pPrevCol = puVar7;
    }
    ppuVar12[uVar13] = puVar7;
    puVar9 = pCol->pList;
    if (puVar9 != (unqlite_col_record *)0x0) {
      puVar7->pNext = puVar9;
      puVar9->pPrev = puVar7;
    }
    pCol->pList = puVar7;
    uVar13 = pCol->nRec + 1;
    pCol->nRec = uVar13;
    bVar14 = uVar13 < uVar1 * 3;
    puVar7 = (unqlite_col_record *)(ulong)CONCAT31((int3)(uVar13 >> 8),99999 < uVar13 || bVar14);
    if (99999 >= uVar13 && !bVar14) {
      puVar9 = (unqlite_col_record *)SyMemBackendAlloc(&pCol->pVm->sAlloc,uVar1 << 4);
      puVar7 = puVar9;
      if (puVar9 != (unqlite_col_record *)0x0) {
        if ((uVar1 & 0xfffffff) != 0) {
          puVar10 = (unqlite_col_record *)((long)&puVar9->pCol + (ulong)(uVar1 << 4));
          do {
            *(undefined1 *)&puVar7->pCol = 0;
            puVar11 = (unqlite_col_record *)((long)&puVar7->pCol + 1);
            if (puVar10 <= puVar11) break;
            *(undefined1 *)&puVar11->pCol = 0;
            puVar11 = (unqlite_col_record *)((long)&puVar7->pCol + 2);
            if (puVar10 <= puVar11) break;
            *(undefined1 *)&puVar11->pCol = 0;
            puVar11 = (unqlite_col_record *)((long)&puVar7->pCol + 3);
            if (puVar10 <= puVar11) break;
            *(undefined1 *)&puVar11->pCol = 0;
            puVar7 = (unqlite_col_record *)((long)&puVar7->pCol + 4);
          } while (puVar7 < puVar10);
        }
        sVar5 = pCol->nRec;
        if (sVar5 != 0) {
          ppuVar12 = &pCol->pList;
          do {
            puVar3 = (unqlite_col *)*ppuVar12;
            *(undefined8 *)&(puVar3->sSchema).sBlob.nFlags = 0;
            *(undefined8 *)&(puVar3->sSchema).nIdx = 0;
            uVar13 = *(uint *)&(puVar3->sName).zString & uVar1 * 2 - 1;
            puVar4 = (&puVar9->pCol)[uVar13];
            *(unqlite_col **)&(puVar3->sSchema).sBlob.nFlags = puVar4;
            if (puVar4 != (unqlite_col *)0x0) {
              *(unqlite_col **)&(puVar4->sSchema).nIdx = puVar3;
            }
            (&puVar9->pCol)[uVar13] = puVar3;
            ppuVar12 = (unqlite_col_record **)&puVar3->nSchemaOfft;
            sVar5 = sVar5 - 1;
          } while (sVar5 != 0);
        }
        uVar13 = SyMemBackendFree(&pCol->pVm->sAlloc,pCol->apRecord);
        puVar7 = (unqlite_col_record *)(ulong)uVar13;
        pCol->apRecord = (unqlite_col_record **)puVar9;
        pCol->nRecSize = uVar1 * 2;
      }
    }
  }
  return (int)puVar7;
}

Assistant:

static int CollectionCacheInstallRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* JSON value */
	)
{
	unqlite_col_record *pRecord;
	sxu32 iBucket;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord ){
		/* Record already installed, overwrite its old value  */
		jx9MemObjStore(pValue,&pRecord->sValue);
		return UNQLITE_OK;
	}
	/* Allocate a new instance */
	pRecord = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,sizeof(unqlite_col_record));
	if( pRecord == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRecord,sizeof(unqlite_col_record));
	/* Fill in the structure */
	jx9MemObjInit(pCol->pVm->pJx9Vm,&pRecord->sValue);
	jx9MemObjStore(pValue,&pRecord->sValue);
	pRecord->nId = nId;
	pRecord->pCol = pCol;
	/* Install in the corresponding bucket */
	iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
	pRecord->pNextCol = pCol->apRecord[iBucket];
	if( pCol->apRecord[iBucket] ){
		pCol->apRecord[iBucket]->pPrevCol = pRecord;
	}
	pCol->apRecord[iBucket] = pRecord;
	/* Link */
	MACRO_LD_PUSH(pCol->pList,pRecord);
	pCol->nRec++;
	if( (pCol->nRec >= pCol->nRecSize * 3) && pCol->nRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pCol->nRecSize << 1;
		unqlite_col_record *pEntry;
		unqlite_col_record **apNew;
		sxu32 n;
		
		apNew = (unqlite_col_record **)SyMemBackendAlloc(&pCol->pVm->sAlloc, nNewSize * sizeof(unqlite_col_record *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col_record *));
			/* Rehash all entries */
			n = 0;
			pEntry = pCol->pList;
			for(;;){
				/* Loop one */
				if( n >= pCol->nRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = COL_RECORD_HASH(pEntry->nId) & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pCol->pVm->sAlloc,(void *)pCol->apRecord);
			pCol->apRecord = apNew;
			pCol->nRecSize = nNewSize;
		}
	}
	/* All done */
	return UNQLITE_OK;
}